

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int libssh2_session_handshake(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  char *__src;
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  size_t sVar4;
  ssize_t sVar5;
  uchar *puVar6;
  char *pcVar7;
  size_t *psVar8;
  ulong uVar9;
  char local_79;
  size_t *local_78;
  libssh2_socket_t local_6c;
  key_exchange_state_t *local_68;
  uchar *local_60;
  uchar *local_58;
  packet_require_state_t *local_50;
  uchar **local_48;
  uchar *local_40;
  time_t local_38;
  
  local_6c = sock;
  local_38 = time((time_t *)0x0);
  __src = session->banner_TxRx_banner;
  local_68 = &session->startup_key_state;
  local_40 = session->startup_service;
  local_58 = session->startup_service + 1;
  local_60 = session->startup_service + 5;
  local_48 = &session->startup_data;
  psVar8 = &session->startup_data_len;
  local_50 = &session->startup_req_state;
  local_78 = psVar8;
LAB_00108fa5:
  switch(session->startup_state) {
  case libssh2_NB_state_idle:
    if (local_6c == -1) {
      iVar2 = -0x2d;
      pcVar7 = "Bad socket provided";
    }
    else {
      session->socket_fd = local_6c;
      uVar1 = fcntl(local_6c,3,0);
      uVar1 = uVar1 >> 0xb & 1;
      session->socket_prev_blockstate = uVar1 ^ 1;
      if ((uVar1 != 0) || (iVar2 = session_nonblock(session->socket_fd,1), iVar2 == 0)) {
        session->startup_state = libssh2_NB_state_created;
        goto switchD_00108fc3_caseD_2;
      }
      pcVar7 = "Failed changing socket\'s blocking state to non-blocking";
    }
    goto LAB_001093dd;
  default:
    return -0x22;
  case libssh2_NB_state_created:
switchD_00108fc3_caseD_2:
    pcVar7 = "SSH-2.0-libssh2_1.11.0\r\n";
    sVar4 = 0x18;
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      puVar6 = (session->local).banner;
      pcVar7 = "SSH-2.0-libssh2_1.11.0\r\n";
      if (puVar6 != (uchar *)0x0) {
        sVar4 = strlen((char *)puVar6);
        pcVar7 = (char *)puVar6;
      }
      session->banner_TxRx_state = libssh2_NB_state_created;
    }
    *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfd;
    sVar5 = (*session->send)(session->socket_fd,(uchar *)pcVar7 + session->banner_TxRx_total_send,
                             sVar4 - session->banner_TxRx_total_send,
                             (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
    if (0 < sVar5) {
      session->total_bytes_sent = session->total_bytes_sent + sVar5;
    }
    psVar8 = local_78;
    if (sVar5 == sVar4 - session->banner_TxRx_total_send) {
      session->banner_TxRx_total_send = 0;
      session->startup_state = libssh2_NB_state_sent;
      session->banner_TxRx_state = libssh2_NB_state_idle;
      break;
    }
    if (sVar5 < 0 && sVar5 != -0xb) {
      session->banner_TxRx_state = libssh2_NB_state_idle;
      session->banner_TxRx_total_send = 0;
      iVar2 = -0x2b;
      pcVar7 = "Failed sending banner";
      goto LAB_0010948a;
    }
    session->socket_block_directions = 2;
    if (0 < sVar5) {
      session->banner_TxRx_total_send = session->banner_TxRx_total_send + sVar5;
    }
    goto LAB_001093eb;
  case libssh2_NB_state_sent:
    break;
  case libssh2_NB_state_sent1:
    goto switchD_00108fc3_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00108fc3_caseD_5;
  case libssh2_NB_state_sent3:
    goto switchD_00108fc3_caseD_6;
  case libssh2_NB_state_sent4:
    goto switchD_00108fc3_caseD_7;
  }
  do {
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      session->banner_TxRx_state = libssh2_NB_state_created;
      goto LAB_001090f0;
    }
    uVar9 = session->banner_TxRx_total_send;
    while ((uVar9 < 0x100 && ((uVar9 == 0 || (__src[uVar9 - 1] != '\n'))))) {
      local_79 = '\0';
      *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfe;
      sVar5 = (*session->recv)(session->socket_fd,&local_79,1,
                               (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
      if (sVar5 < 1) {
        if (sVar5 < 0) {
          if (sVar5 == -0xb) {
            session->socket_block_directions = 1;
            session->banner_TxRx_total_send = uVar9;
            iVar2 = -0x25;
          }
          else {
            session->banner_TxRx_state = libssh2_NB_state_idle;
            session->banner_TxRx_total_send = 0;
            iVar2 = -0x2b;
          }
        }
        else {
          session->socket_state = -1;
          iVar2 = -0xd;
        }
        goto LAB_0010924f;
      }
      session->total_bytes_received = session->total_bytes_received + sVar5;
      if ((uVar9 == 0) && (local_79 == '\r' || local_79 == '\n')) {
LAB_001090f0:
        uVar9 = 0;
      }
      else {
        if (local_79 == '\0') {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          session->banner_TxRx_total_send = 0;
          iVar2 = -2;
          goto LAB_0010924f;
        }
        __src[uVar9] = local_79;
        uVar9 = uVar9 + 1;
      }
    }
    do {
      sVar4 = uVar9;
      if (sVar4 == 0) {
        session->banner_TxRx_state = libssh2_NB_state_idle;
        session->banner_TxRx_total_send = 0;
        iVar2 = -2;
        psVar8 = local_78;
        goto LAB_0010935b;
      }
      uVar9 = sVar4 - 1;
    } while ((session->banner_TxRx_banner[sVar4 - 1] == '\r') ||
            (session->banner_TxRx_banner[sVar4 - 1] == '\n'));
    session->banner_TxRx_state = libssh2_NB_state_idle;
    session->banner_TxRx_total_send = 0;
    puVar6 = (session->remote).banner;
    if (puVar6 != (uchar *)0x0) {
      (*session->free)(puVar6,&session->abstract);
    }
    puVar6 = (uchar *)(*session->alloc)(sVar4 + 1,&session->abstract);
    (session->remote).banner = puVar6;
    if (puVar6 == (uchar *)0x0) {
      iVar2 = _libssh2_error(session,-6,"Error allocating space for remote banner");
      psVar8 = local_78;
LAB_0010924f:
      if (iVar2 != 0) {
        if (iVar2 == -0x25) goto LAB_001093eb;
LAB_0010935b:
        pcVar7 = "Failed getting banner";
        goto LAB_001093dd;
      }
    }
    else {
      memcpy(puVar6,__src,sVar4);
      (session->remote).banner[sVar4] = '\0';
      psVar8 = local_78;
    }
    iVar2 = strncmp("SSH-",(char *)(session->remote).banner,4);
  } while (iVar2 != 0);
  session->startup_state = libssh2_NB_state_sent1;
switchD_00108fc3_caseD_4:
  iVar2 = _libssh2_kex_exchange(session,0,local_68);
  if (iVar2 != -0x25) {
    if (iVar2 != 0) {
      pcVar7 = "Unable to exchange encryption keys";
      goto LAB_001093dd;
    }
    session->startup_state = libssh2_NB_state_sent2;
switchD_00108fc3_caseD_5:
    session->startup_service[0] = '\x05';
    _libssh2_htonu32(local_58,0xc);
    builtin_memcpy(local_60,"ssh-userauth",0xc);
    session->startup_state = libssh2_NB_state_sent3;
switchD_00108fc3_caseD_6:
    iVar2 = _libssh2_transport_send(session,local_40,0x11,(uchar *)0x0,0);
    if (iVar2 == -0x25) goto LAB_001093eb;
    if (iVar2 == 0) {
      session->startup_state = libssh2_NB_state_sent4;
switchD_00108fc3_caseD_7:
      iVar2 = _libssh2_packet_require(session,'\x06',local_48,psVar8,0,(uchar *)0x0,0,local_50);
      if (iVar2 != 0) {
        pcVar7 = "Failed to get response to ssh-userauth request";
        goto LAB_001093dd;
      }
      if (*psVar8 < 5) {
        iVar2 = -0xe;
        pcVar7 = "Unexpected packet length";
        goto LAB_001093dd;
      }
      uVar3 = _libssh2_ntohu32(session->startup_data + 1);
      session->startup_service_length = (ulong)uVar3;
      puVar6 = session->startup_data;
      if ((uVar3 == 0xc) && (iVar2 = strncmp("ssh-userauth",(char *)(puVar6 + 5),0xc), iVar2 == 0))
      {
        (*session->free)(puVar6,&session->abstract);
        session->startup_data = (uchar *)0x0;
        session->startup_state = libssh2_NB_state_idle;
        return 0;
      }
      (*session->free)(puVar6,&session->abstract);
      session->startup_data = (uchar *)0x0;
      iVar2 = -0xe;
      pcVar7 = "Invalid response received from server";
LAB_0010948a:
      iVar2 = _libssh2_error(session,iVar2,pcVar7);
      psVar8 = local_78;
    }
    else {
      pcVar7 = "Unable to ask for ssh-userauth service";
LAB_001093dd:
      iVar2 = _libssh2_error(session,iVar2,pcVar7);
    }
    if (iVar2 != -0x25) {
      return iVar2;
    }
  }
LAB_001093eb:
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar2 = _libssh2_wait_socket(session,local_38);
  if (iVar2 != 0) {
    return iVar2;
  }
  goto LAB_00108fa5;
}

Assistant:

LIBSSH2_API int
libssh2_session_handshake(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    BLOCK_ADJUST(rc, session, session_startup(session, sock));

    return rc;
}